

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::SetDrawTarget(PixelGameEngine *this,uint8_t layer)

{
  size_type sVar1;
  reference pvVar2;
  uint8_t layer_local;
  PixelGameEngine *this_local;
  
  sVar1 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::size(&this->vLayers);
  if (layer < sVar1) {
    pvVar2 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                       (&this->vLayers,(ulong)layer);
    this->pDrawTarget = pvVar2->pDrawTarget;
    pvVar2 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                       (&this->vLayers,(ulong)layer);
    pvVar2->bUpdate = true;
    this->nTargetLayer = layer;
  }
  return;
}

Assistant:

void PixelGameEngine::SetDrawTarget(uint8_t layer)
	{
		if (layer < vLayers.size())
		{
			pDrawTarget = vLayers[layer].pDrawTarget;
			vLayers[layer].bUpdate = true;
			nTargetLayer = layer;
		}
	}